

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

SQInteger __thiscall
SQArray::Next(SQArray *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQTable *pSVar4;
  SQObjectType SVar5;
  SQTable *pSVar6;
  undefined1 *puVar7;
  SQObjectPtr *pSVar8;
  SQObjectValue *pSVar9;
  
  pSVar6 = (SQTable *)TranslateIndex(refpos);
  puVar7 = (undefined1 *)0xffffffffffffffff;
  if (pSVar6 < (SQTable *)(this->_values)._size) {
    if (((outkey->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (outkey->super_SQObject)._type = OT_INTEGER;
    (outkey->super_SQObject)._unVal.pTable = pSVar6;
    pSVar8 = (this->_values)._vals + (long)pSVar6;
    pSVar9 = &(pSVar8->super_SQObject)._unVal;
    SVar5 = (pSVar8->super_SQObject)._type;
    if (SVar5 == OT_WEAKREF) {
      SVar5 = *(SQObjectType *)&pSVar9->pString->_sharedstate;
      pSVar9 = (SQObjectValue *)&pSVar9->pString->_next;
    }
    pSVar3 = pSVar9->pTable;
    SVar2 = (outval->super_SQObject)._type;
    pSVar4 = (outval->super_SQObject)._unVal.pTable;
    (outval->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)pSVar3;
    (outval->super_SQObject)._type = SVar5;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    puVar7 = (undefined1 *)
             ((long)&(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                     _vptr_SQRefCounted + 1);
  }
  return (SQInteger)puVar7;
}

Assistant:

SQInteger Next(const SQObjectPtr &refpos,SQObjectPtr &outkey,SQObjectPtr &outval)
    {
        SQUnsignedInteger idx=TranslateIndex(refpos);
        while(idx<_values.size()){
            //first found
            outkey=(SQInteger)idx;
            SQObjectPtr &o = _values[idx];
            outval = _realval(o);
            //return idx for the next iteration
            return ++idx;
        }
        //nothing to iterate anymore
        return -1;
    }